

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

void gc_traverse_trace(global_State *g,GCtrace *T)

{
  IRIns *pIVar1;
  GCobj *o;
  uint uVar2;
  ulong uVar3;
  
  if (T->traceno != 0) {
    for (uVar2 = T->nk; uVar2 < 0x7ffd; uVar2 = uVar2 + 1) {
      pIVar1 = T->ir;
      uVar3 = (ulong)uVar2;
      if ((*(char *)((long)pIVar1 + uVar3 * 8 + 5) == '\x18') &&
         ((*(uint8_t *)((long)pIVar1[uVar3 + 1] + 8) & 3) != 0)) {
        gc_mark(g,(GCobj *)pIVar1[uVar3 + 1]);
      }
      if ((0x605fd9U >> (*(uint *)((long)pIVar1 + uVar3 * 8 + 4) & 0x1f) & 1) != 0) {
        uVar2 = uVar2 + (*(char *)((long)pIVar1 + uVar3 * 8 + 5) != '\x1b');
      }
    }
    if (T->link != 0) {
      gc_marktrace(g,(uint)T->link);
    }
    if (T->nextroot != 0) {
      gc_marktrace(g,(uint)T->nextroot);
    }
    if (T->nextside != 0) {
      gc_marktrace(g,(uint)T->nextside);
    }
    o = (GCobj *)(T->startpt).gcptr64;
    if (((o->gch).marked & 3) != 0) {
      gc_mark(g,o);
      return;
    }
  }
  return;
}

Assistant:

static void gc_traverse_trace(global_State *g, GCtrace *T)
{
  IRRef ref;
  if (T->traceno == 0) return;
  for (ref = T->nk; ref < REF_TRUE; ref++) {
    IRIns *ir = &T->ir[ref];
    if (ir->o == IR_KGC)
      gc_markobj(g, ir_kgc(ir));
    if (irt_is64(ir->t) && ir->o != IR_KNULL)
      ref++;
  }
  if (T->link) gc_marktrace(g, T->link);
  if (T->nextroot) gc_marktrace(g, T->nextroot);
  if (T->nextside) gc_marktrace(g, T->nextside);
  gc_markobj(g, gcref(T->startpt));
}